

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

GMTOffsetField * icu_63::GMTOffsetField::createText(UnicodeString *text,UErrorCode *status)

{
  UBool UVar1;
  int32_t n;
  UnicodeString *this;
  UChar *pUVar2;
  char16_t *src;
  UErrorCode *size;
  UnicodeString *local_50;
  int32_t len;
  GMTOffsetField *result;
  UErrorCode *status_local;
  UnicodeString *text_local;
  
  size = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this = (UnicodeString *)UMemory::operator_new((UMemory *)0x18,(size_t)size);
    local_50 = (UnicodeString *)0x0;
    if (this != (UnicodeString *)0x0) {
      GMTOffsetField((GMTOffsetField *)this);
      local_50 = this;
    }
    if (local_50 == (UnicodeString *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      text_local = (UnicodeString *)0x0;
    }
    else {
      n = UnicodeString::length(text);
      pUVar2 = (UChar *)uprv_malloc_63((long)(n + 1) << 1);
      *(UChar **)&local_50->fUnion = pUVar2;
      if (*(UChar **)&local_50->fUnion == (UChar *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        if (local_50 != (UnicodeString *)0x0) {
          (*(local_50->super_Replaceable).super_UObject._vptr_UObject[1])();
        }
        text_local = (UnicodeString *)0x0;
      }
      else {
        pUVar2 = *(UChar **)&local_50->fUnion;
        src = UnicodeString::getBuffer(text);
        u_strncpy_63(pUVar2,src,n);
        (*(UChar **)&local_50->fUnion)[n] = L'\0';
        (local_50->fUnion).fFields.fCapacity = TEXT;
        text_local = local_50;
      }
    }
  }
  else {
    text_local = (UnicodeString *)0x0;
  }
  return (GMTOffsetField *)text_local;
}

Assistant:

GMTOffsetField*
GMTOffsetField::createText(const UnicodeString& text, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return NULL;
    }
    GMTOffsetField* result = new GMTOffsetField();
    if (result == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }

    int32_t len = text.length();
    result->fText = (UChar*)uprv_malloc((len + 1) * sizeof(UChar));
    if (result->fText == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        delete result;
        return NULL;
    }
    u_strncpy(result->fText, text.getBuffer(), len);
    result->fText[len] = 0;
    result->fType = TEXT;

    return result;
}